

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O0

void __thiscall
psy::C::InternalsTestSuite::parse
          (InternalsTestSuite *this,string *source,Expectation *X,SyntaxCategory syntaxCat,
          ParseOptions parseOpts)

{
  ParseOptions PVar1;
  bool bVar2;
  __type _Var3;
  pointer pSVar4;
  SyntaxNode *pSVar5;
  ulong uVar6;
  ostream *poVar7;
  void *pvVar8;
  undefined8 uVar9;
  reference pSVar10;
  SyntaxKind kind;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_690;
  undefined8 local_688;
  char *local_680;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_678;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_670;
  undefined8 local_668;
  undefined1 local_660 [8];
  string namesP;
  iterator iStack_618;
  SyntaxKind k;
  iterator __end1;
  iterator __begin1;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *__range1;
  string names;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  undefined8 local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  undefined8 local_568;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  undefined8 local_558;
  char *local_550;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_540;
  undefined8 local_538;
  undefined8 local_530;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  undefined8 local_520;
  char *local_518;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  undefined8 local_500;
  undefined1 local_4f8 [8];
  string textP;
  Unparser unparser;
  ostringstream ossText;
  undefined1 local_348 [8];
  SyntaxNamePrinter printer;
  ostringstream ossTree;
  Expectation local_1a8;
  undefined4 local_f0;
  allocator<char> local_e9;
  string local_e8 [32];
  ParseOptions local_c8;
  string local_a0 [32];
  SourceText local_80;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  string text;
  SyntaxCategory syntaxCat_local;
  Expectation *X_local;
  string *source_local;
  InternalsTestSuite *this_local;
  
  text.field_2._M_local_buf[0xf] = syntaxCat;
  std::__cxx11::string::string((string *)local_48,(string *)source);
  if ((X->containsAmbiguity_ & 1U) != 0) {
    ParseOptions::setAmbiguityMode(&parseOpts,Diagnose);
  }
  std::__cxx11::string::string(local_a0,(string *)local_48);
  psy::SourceText::SourceText(&local_80,local_a0);
  PVar1 = parseOpts;
  local_c8.langDialect_.std_ = parseOpts.langDialect_.std_;
  local_c8._1_7_ = parseOpts._1_7_;
  parseOpts.langExts_.translations_.field_0 = PVar1.langExts_.translations_.field_0;
  local_c8.langExts_.translations_ = (MacroTranslations)parseOpts.langExts_.translations_.field_0;
  parseOpts.langExts_.field_1.BF_all_ = PVar1.langExts_.field_1;
  local_c8.langExts_.field_1 = parseOpts.langExts_.field_1;
  parseOpts._24_8_ = PVar1._24_8_;
  local_c8.field_2 = parseOpts.field_2;
  local_c8._26_6_ = parseOpts._26_6_;
  parseOpts = PVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"",&local_e9);
  PVar1.langExts_.translations_.field_0 = local_c8.langExts_.translations_.field_0;
  PVar1.langDialect_.std_ = local_c8.langDialect_.std_;
  PVar1._1_7_ = local_c8._1_7_;
  PVar1.langExts_.field_1.BF_all_ = local_c8.langExts_.field_1.BF_all_;
  PVar1.field_2 = local_c8.field_2;
  PVar1._26_6_ = local_c8._26_6_;
  SyntaxTree::parseText
            ((SourceText *)local_60,(TextPreprocessingState)&local_80,Unknown,PVar1,(string *)0x2,
             (SyntaxCategory)local_e8);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::operator=
            (&this->tree_,
             (unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_60);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_60);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  SourceText::~SourceText(&local_80);
  std::__cxx11::string::~string(local_a0);
  if ((X->numE_ == 0) && (X->numW_ == 0)) {
    pSVar4 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::
             operator->(&this->tree_);
    bVar2 = SyntaxTree::parseExitedEarly(pSVar4);
    if (bVar2) {
      if ((X->unfinishedParse_ & 1U) != 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpression is NOT ");
        poVar7 = std::operator<<(poVar7,"true");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,0xe4);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        uVar9 = __cxa_allocate_exception(1);
        __cxa_throw(uVar9,&TestFailed::typeinfo,0);
      }
      local_f0 = 1;
      goto LAB_00587294;
    }
  }
  Expectation::Expectation(&local_1a8,X);
  bVar2 = checkErrorAndWarn(this,&local_1a8);
  Expectation::~Expectation(&local_1a8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &printer.dump_.
                super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar4 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::get
                       (&this->tree_);
    SyntaxNamePrinter::SyntaxDumper((SyntaxNamePrinter *)local_348,pSVar4);
    pSVar4 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::
             operator->(&this->tree_);
    pSVar5 = SyntaxTree::root(pSVar4);
    SyntaxNamePrinter::print
              ((SyntaxNamePrinter *)local_348,pSVar5,Plain,
               (ostream *)
               &printer.dump_.
                super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&unparser.os_);
    pSVar4 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::get
                       (&this->tree_);
    Unparser::SyntaxDumper((Unparser *)((long)&textP.field_2 + 8),pSVar4);
    pSVar4 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::
             operator->(&this->tree_);
    pSVar5 = SyntaxTree::root(pSVar4);
    Unparser::unparse((Unparser *)((long)&textP.field_2 + 8),pSVar5,(ostream *)&unparser.os_);
    std::__cxx11::ostringstream::str();
    local_510._M_current = (char *)std::__cxx11::string::begin();
    local_518 = (char *)std::__cxx11::string::end();
    local_508 = std::
                remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                          (local_510,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_518,isspace);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_500,&local_508);
    local_528._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_520,&local_528);
    local_530 = std::__cxx11::string::erase(local_4f8,local_500,local_520);
    local_548._M_current = (char *)std::__cxx11::string::begin();
    local_550 = (char *)std::__cxx11::string::end();
    local_540 = std::
                remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                          (local_548,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_550,isspace);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_538,&local_540);
    local_560._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_558,&local_560);
    local_568 = std::__cxx11::string::erase(local_48,local_538,local_558);
    if ((X->containsAmbiguity_ & 1U) == 0) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_4f8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48);
      if (!_Var3) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = std::operator<<(poVar7,(string *)local_4f8);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        poVar7 = std::operator<<(poVar7,(string *)local_48);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,0x10e);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        uVar9 = __cxa_allocate_exception(1);
        __cxa_throw(uVar9,&TestFailed::typeinfo,0);
      }
    }
    else {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_5c0._M_current = (char *)std::__cxx11::string::begin();
        local_5c8 = (char *)std::__cxx11::string::end();
        local_5b8 = std::
                    remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                              (local_5c0,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_5c8,isspace);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_5b0,&local_5b8);
        local_5d8._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_5d0,&local_5d8);
        names.field_2._8_8_ = std::__cxx11::string::erase(&X->ambiguityText_,local_5b0,local_5d0);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4f8,&X->ambiguityText_);
        if (!_Var3) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
          poVar7 = std::operator<<(poVar7,(string *)local_4f8);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
          poVar7 = std::operator<<(poVar7,(string *)&X->ambiguityText_);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"\t\t");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,0x10a);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          uVar9 = __cxa_allocate_exception(1);
          __cxa_throw(uVar9,&TestFailed::typeinfo,0);
        }
      }
      else {
        std::operator+(&local_588,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4f8,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        if (((_Var3 ^ 0xffU) & 1) != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
          poVar7 = std::operator<<(poVar7,(string *)local_4f8);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
          std::operator+(&local_5a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48);
          poVar7 = std::operator<<(poVar7,(string *)&local_5a8);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"\t\t");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,0x104);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_5a8);
          uVar9 = __cxa_allocate_exception(1);
          __cxa_throw(uVar9,&TestFailed::typeinfo,0);
        }
      }
    }
    bVar2 = std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::empty
                      (&X->syntaxKinds_);
    if (bVar2) {
      local_f0 = 1;
    }
    else {
      std::__cxx11::string::string((string *)&__range1);
      __end1 = std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::begin
                         (&X->syntaxKinds_);
      iStack_618 = std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::end
                             (&X->syntaxKinds_);
      while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffff9e8), bVar2) {
        pSVar10 = __gnu_cxx::
                  __normal_iterator<psy::C::SyntaxKind_*,_std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>_>
                  ::operator*(&__end1);
        to_string_abi_cxx11_((string *)((long)&namesP.field_2 + 8),(C *)(ulong)*pSVar10,kind);
        std::__cxx11::string::operator+=
                  ((string *)&__range1,(string *)(namesP.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(namesP.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<psy::C::SyntaxKind_*,_std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::ostringstream::str();
      local_678._M_current = (char *)std::__cxx11::string::begin();
      local_680 = (char *)std::__cxx11::string::end();
      local_670 = std::
                  remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                            (local_678,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_680,isspace);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_668,&local_670);
      local_690._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_688,&local_690);
      std::__cxx11::string::erase(local_660,local_668,local_688);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_660,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range1);
      if (!_Var3) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = std::operator<<(poVar7,(string *)local_660);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        poVar7 = std::operator<<(poVar7,(string *)&__range1);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,0x119);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        uVar9 = __cxa_allocate_exception(1);
        __cxa_throw(uVar9,&TestFailed::typeinfo,0);
      }
      std::__cxx11::string::~string((string *)local_660);
      std::__cxx11::string::~string((string *)&__range1);
      local_f0 = 0;
    }
    std::__cxx11::string::~string((string *)local_4f8);
    Unparser::~Unparser((Unparser *)((long)&textP.field_2 + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&unparser.os_);
    SyntaxNamePrinter::~SyntaxNamePrinter((SyntaxNamePrinter *)local_348);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &printer.dump_.
                super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    local_f0 = 1;
  }
LAB_00587294:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void InternalsTestSuite::parse(std::string source,
                               Expectation X,
                               SyntaxTree::SyntaxCategory syntaxCat,
                               ParseOptions parseOpts)
{
    auto text = source;

#ifdef DBG_DIAGNOSTICS
    if (X.numW_ > 0 || X.numE_ > 0) {
        std::cout << std::endl;
        if (X.numW_ > 0)
            std::cout << "\t\t[expect (parser) WARNING]\n";
        if (X.numE_ > 0)
            std::cout << "\t\t[expect (parser) ERROR]\n";
    }
#endif

    if (X.containsAmbiguity_)
        parseOpts.setAmbiguityMode(ParseOptions::AmbiguityMode::Diagnose);

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  TextCompleteness::Fragment,
                                  parseOpts,
                                  "",
                                  syntaxCat);

    if (X.numE_ == 0 && X.numW_ == 0 && tree_->parseExitedEarly()) {
        PSY_EXPECT_TRUE(X.unfinishedParse_);
        return;
    }

    if (!checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}